

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nginx.c
# Opt level: O2

char * ngx_set_env(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  void *pvVar1;
  long *plVar2;
  char *pcVar3;
  long lVar4;
  
  plVar2 = (long *)ngx_array_push((ngx_array_t *)((long)conf + 0xb0));
  if (plVar2 == (long *)0x0) {
    pcVar3 = (char *)0xffffffffffffffff;
  }
  else {
    pvVar1 = cf->args->elts;
    lVar4 = *(long *)((long)pvVar1 + 0x18);
    *plVar2 = *(long *)((long)pvVar1 + 0x10);
    plVar2[1] = lVar4;
    pcVar3 = (char *)0x0;
    for (lVar4 = 0; *(long *)((long)pvVar1 + 0x10) != lVar4; lVar4 = lVar4 + 1) {
      if (*(char *)(*(long *)((long)pvVar1 + 0x18) + lVar4) == '=') {
        *plVar2 = lVar4;
        return (char *)0x0;
      }
    }
  }
  return pcVar3;
}

Assistant:

static char *
ngx_set_env(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_core_conf_t  *ccf = conf;

    ngx_str_t   *value, *var;
    ngx_uint_t   i;

    var = ngx_array_push(&ccf->env);
    if (var == NULL) {
        return NGX_CONF_ERROR;
    }

    value = cf->args->elts;
    *var = value[1];

    for (i = 0; i < value[1].len; i++) {

        if (value[1].data[i] == '=') {

            var->len = i;

            return NGX_CONF_OK;
        }
    }

    return NGX_CONF_OK;
}